

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.h
# Opt level: O2

bool leveldb::ParseInternalKey(Slice *internal_key,ParsedInternalKey *result)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  ValueType VVar5;
  long in_FS_OFFSET;
  bool bVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = internal_key->size_;
  if (uVar2 < 8) {
    bVar6 = false;
  }
  else {
    pcVar3 = internal_key->data_;
    uVar4 = *(ulong *)(pcVar3 + (uVar2 - 8));
    VVar5 = (ValueType)uVar4 & 0xff;
    result->sequence = uVar4 >> 8;
    result->type = VVar5;
    (result->user_key).data_ = pcVar3;
    (result->user_key).size_ = uVar2 - 8;
    bVar6 = VVar5 < 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

inline bool ParseInternalKey(const Slice& internal_key,
                             ParsedInternalKey* result) {
  const size_t n = internal_key.size();
  if (n < 8) return false;
  uint64_t num = DecodeFixed64(internal_key.data() + n - 8);
  uint8_t c = num & 0xff;
  result->sequence = num >> 8;
  result->type = static_cast<ValueType>(c);
  result->user_key = Slice(internal_key.data(), n - 8);
  return (c <= static_cast<uint8_t>(kTypeValue));
}